

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O2

char rtosc_type(char *msg,uint nargument)

{
  char cVar1;
  char *pcVar2;
  
  pcVar2 = rtosc_argument_string(msg);
  do {
    cVar1 = *pcVar2;
    if ((cVar1 != '[') && (cVar1 != ']')) {
      if ((nargument == 0) || (cVar1 == '\0')) {
        return cVar1;
      }
      nargument = nargument - 1;
    }
    pcVar2 = pcVar2 + 1;
  } while( true );
}

Assistant:

char rtosc_type(const char *msg, unsigned nargument)
{
    assert(nargument < rtosc_narguments(msg));
    const char *arg = rtosc_argument_string(msg);
    while(1) {
        if(*arg == '[' || *arg == ']')
            ++arg;
        else if(!nargument || !*arg)
            return *arg;
        else
            ++arg, --nargument;
    }
}